

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContextTest.cpp
# Opt level: O3

void __thiscall
ContextTest_shouldSetControlRequestChannel_Test::TestBody
          (ContextTest_shouldSetControlRequestChannel_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  char *in_R9;
  bool bVar3;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ChannelUri uri;
  Configuration cfg;
  Context ctx;
  AssertHelper local_2c0;
  AssertHelper local_2b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  string local_2a8;
  undefined1 local_288 [8];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  ChannelUri local_260;
  Configuration local_1d0;
  Context local_120;
  
  aeron::archive::Configuration::Configuration(&local_1d0);
  aeron::archive::Context::Context(&local_120,&local_1d0);
  psVar2 = aeron::archive::Context::controlRequestChannel_abi_cxx11_(&local_120);
  bVar3 = psVar2->_M_string_length == 0;
  local_288[0] = (internal)!bVar3;
  local_280._0_8_ = (type)0x0;
  if (bVar3) {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_260.prefix_,(internal *)local_288,
               (AssertionResult *)"ctx.controlRequestChannel().empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x1c,local_260.prefix_._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.prefix_._M_dataplus._M_p != &local_260.prefix_.field_2) {
      operator_delete(local_260.prefix_._M_dataplus._M_p,
                      local_260.prefix_.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_2a8._M_dataplus._M_p != (long *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((long *)local_2a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_2a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_280,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar2 = aeron::archive::Context::controlRequestChannel_abi_cxx11_(&local_120);
  aeron::archive::ChannelUri::parse(&local_260,psVar2);
  paVar1 = &local_2a8.field_2;
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"term-length","");
  aeron::archive::ChannelUri::get
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_288,&local_260,&local_2a8);
  local_2b8.data_._0_1_ = local_288[0];
  local_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_288[0] == (internal)0x1) {
    if ((undefined1 *)local_280._0_8_ != local_270) {
      operator_delete((void *)local_280._0_8_,local_270._0_8_ + 1);
    }
    local_288[0] = (internal)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_288,(internal *)&local_2b8,
               (AssertionResult *)"uri.get(\"term-length\")","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x1f,(char *)CONCAT71(local_288._1_7_,local_288[0]));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((undefined1 *)CONCAT71(local_288._1_7_,local_288[0]) != local_280 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_288._1_7_,local_288[0]),local_280._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"mtu","");
  aeron::archive::ChannelUri::get
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_288,&local_260,&local_2a8);
  local_2b8.data_._0_1_ = local_288[0];
  local_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_288[0] == (internal)0x1) {
    if ((undefined1 *)local_280._0_8_ != local_270) {
      operator_delete((void *)local_280._0_8_,local_270._0_8_ + 1);
    }
    local_288[0] = (internal)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_288,(internal *)&local_2b8,(AssertionResult *)"uri.get(\"mtu\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x20,(char *)CONCAT71(local_288._1_7_,local_288[0]));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((undefined1 *)CONCAT71(local_288._1_7_,local_288[0]) != local_280 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_288._1_7_,local_288[0]),local_280._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"sparse","");
  aeron::archive::ChannelUri::get
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_288,&local_260,&local_2a8);
  local_2b8.data_._0_1_ = local_288[0];
  local_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_288[0] == (internal)0x1) {
    if ((undefined1 *)local_280._0_8_ != local_270) {
      operator_delete((void *)local_280._0_8_,local_270._0_8_ + 1);
    }
    local_288[0] = (internal)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_2b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_288,(internal *)&local_2b8,(AssertionResult *)"uri.get(\"sparse\")",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/test/ContextTest.cpp"
               ,0x21,(char *)CONCAT71(local_288._1_7_,local_288[0]));
    testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    if ((undefined1 *)CONCAT71(local_288._1_7_,local_288[0]) != local_280 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_288._1_7_,local_288[0]),local_280._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_2a8._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260.tags_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_260.params_._M_h);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.media_._M_dataplus._M_p != &local_260.media_.field_2) {
    operator_delete(local_260.media_._M_dataplus._M_p,
                    local_260.media_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.prefix_._M_dataplus._M_p != &local_260.prefix_.field_2) {
    operator_delete(local_260.prefix_._M_dataplus._M_p,
                    local_260.prefix_.field_2._M_allocated_capacity + 1);
  }
  aeron::archive::Context::~Context(&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.recordingEventsChannel._M_dataplus._M_p !=
      &local_1d0.recordingEventsChannel.field_2) {
    operator_delete(local_1d0.recordingEventsChannel._M_dataplus._M_p,
                    local_1d0.recordingEventsChannel.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.controlResponseChannel._M_dataplus._M_p !=
      &local_1d0.controlResponseChannel.field_2) {
    operator_delete(local_1d0.controlResponseChannel._M_dataplus._M_p,
                    local_1d0.controlResponseChannel.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.localControlChannel._M_dataplus._M_p != &local_1d0.localControlChannel.field_2) {
    operator_delete(local_1d0.localControlChannel._M_dataplus._M_p,
                    local_1d0.localControlChannel.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.controlChannel._M_dataplus._M_p != &local_1d0.controlChannel.field_2) {
    operator_delete(local_1d0.controlChannel._M_dataplus._M_p,
                    local_1d0.controlChannel.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(ContextTest, shouldSetControlRequestChannel) {
    Configuration cfg;
    Context ctx(cfg);

    EXPECT_FALSE(ctx.controlRequestChannel().empty());

    ChannelUri uri = ChannelUri::parse(ctx.controlRequestChannel());
    EXPECT_TRUE(uri.get("term-length"));
    EXPECT_TRUE(uri.get("mtu"));
    EXPECT_TRUE(uri.get("sparse"));
}